

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

bool __thiscall QVariant::view(QVariant *this,int type,void *ptr)

{
  ulong uVar1;
  ulong uVar2;
  PrivateShared *pPVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QMetaType local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ulong *)&(this->d).field_0x18;
  detach(this);
  uVar2 = *(ulong *)&(this->d).field_0x18;
  *(ulong *)&(this->d).field_0x18 = uVar2 & 0xfffffffffffffffd;
  if ((uVar2 & 1) != 0) {
    pPVar3 = (this->d).data.shared;
    this = (QVariant *)
           ((long)&(pPVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int> + (long)pPVar3->offset);
  }
  QMetaType::QMetaType(&local_38,type);
  bVar4 = QMetaType::view((QMetaTypeInterface *)(uVar1 & 0xfffffffffffffffc),this,local_38,ptr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QVariant::view(int type, void *ptr)
{
    return QMetaType::view(d.type(), data(), QMetaType(type), ptr);
}